

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O1

u32 __thiscall
irr::scene::CSceneManager::registerNodeForRendering
          (CSceneManager *this,ISceneNode *node,E_SCENE_NODE_RENDER_PASS pass)

{
  pointer *ppDVar1;
  pointer *ppTVar2;
  IVideoDriver *pIVar3;
  iterator __position;
  pointer ppIVar4;
  ISceneNode *pIVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar8;
  array<irr::scene::ISceneNode_*> *this_00;
  iterator iVar9;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  TransparentNodeEntry e;
  TransparentNodeEntry local_38;
  ISceneNode *local_28;
  
  local_28 = node;
  if ((int)pass < 0x10) {
    if (pass == ESNRP_CAMERA) {
      ppIVar4 = (this->CameraList).m_data.
                super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar6 = (int)((ulong)((long)(this->CameraList).m_data.
                                  super__Vector_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4) >> 3);
      if (iVar6 != 0) {
        lVar8 = 0;
        do {
          if (ppIVar4[lVar8] == node) {
            return 0;
          }
          lVar8 = lVar8 + 1;
        } while (iVar6 != (int)lVar8);
      }
      this_00 = &this->CameraList;
    }
    else {
      if (pass != ESNRP_SKY_BOX) {
        if (pass != ESNRP_SOLID) {
          return 0;
        }
        iVar6 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this);
        if ((char)iVar6 != '\0') {
          return 0;
        }
        goto LAB_001c7150;
      }
      this_00 = &this->SkyBoxList;
    }
  }
  else {
    if ((int)pass < 0x20) {
      if (pass == ESNRP_TRANSPARENT) {
        iVar6 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this);
        if ((char)iVar6 != '\0') {
          return 0;
        }
        local_38.Node = local_28;
        iVar6 = (*local_28->_vptr_ISceneNode[10])();
        lVar8 = CONCAT44(extraout_var_01,iVar6);
        fVar12 = *(float *)(lVar8 + 0x30) - (this->camWorldPos).X;
        fVar13 = *(float *)(lVar8 + 0x34) - (this->camWorldPos).Y;
        fVar14 = *(float *)(lVar8 + 0x38) - (this->camWorldPos).Z;
        local_38.Distance = (f64)(double)(fVar14 * fVar14 + fVar12 * fVar12 + fVar13 * fVar13);
        iVar9._M_current =
             (this->TransparentNodeList).m_data.
             super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->TransparentNodeList).m_data.
            super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
          ::_M_realloc_insert<irr::scene::CSceneManager::TransparentNodeEntry>
                    (&(this->TransparentNodeList).m_data,iVar9,&local_38);
        }
        else {
LAB_001c73f2:
          (iVar9._M_current)->Node = local_38.Node;
          (iVar9._M_current)->Distance = local_38.Distance;
          ppTVar2 = &(this->TransparentNodeList).m_data.
                     super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppTVar2 = *ppTVar2 + 1;
        }
LAB_001c7401:
        (this->TransparentNodeList).is_sorted = false;
        return 1;
      }
      if (pass != ESNRP_AUTOMATIC) {
        return 0;
      }
      iVar6 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this);
      if ((char)iVar6 != '\0') {
        return 0;
      }
      uVar7 = (*local_28->_vptr_ISceneNode[0x16])();
      if (uVar7 != 0) {
        uVar11 = 0;
        do {
          pIVar3 = this->Driver;
          iVar6 = (*local_28->_vptr_ISceneNode[0x15])(local_28,uVar11);
          iVar6 = (*pIVar3->_vptr_IVideoDriver[0x67])(pIVar3,CONCAT44(extraout_var,iVar6));
          if ((char)iVar6 != '\0') {
            local_38.Node = local_28;
            iVar6 = (*local_28->_vptr_ISceneNode[10])();
            lVar8 = CONCAT44(extraout_var_03,iVar6);
            fVar12 = *(float *)(lVar8 + 0x30) - (this->camWorldPos).X;
            fVar13 = *(float *)(lVar8 + 0x34) - (this->camWorldPos).Y;
            fVar14 = *(float *)(lVar8 + 0x38) - (this->camWorldPos).Z;
            local_38.Distance = (f64)(double)(fVar14 * fVar14 + fVar12 * fVar12 + fVar13 * fVar13);
            iVar9._M_current =
                 (this->TransparentNodeList).m_data.
                 super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar9._M_current !=
                (this->TransparentNodeList).m_data.
                super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001c73f2;
            ::std::
            vector<irr::scene::CSceneManager::TransparentNodeEntry,std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>>
            ::_M_realloc_insert<irr::scene::CSceneManager::TransparentNodeEntry_const&>
                      ((vector<irr::scene::CSceneManager::TransparentNodeEntry,std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>>
                        *)&this->TransparentNodeList,iVar9,&local_38);
            goto LAB_001c7401;
          }
          uVar10 = (int)uVar11 + 1;
          uVar11 = (ulong)uVar10;
        } while (uVar7 != uVar10);
      }
LAB_001c7150:
      pIVar5 = local_28;
      local_38.Node = local_28;
      local_38.Distance = 0.0;
      iVar6 = (*local_28->_vptr_ISceneNode[0x16])(local_28);
      if (iVar6 != 0) {
        iVar6 = (*pIVar5->_vptr_ISceneNode[0x15])(pIVar5,0);
        local_38.Distance = *(f64 *)CONCAT44(extraout_var_00,iVar6);
      }
      __position._M_current =
           (this->SolidNodeList).m_data.
           super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->SolidNodeList).m_data.
          super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
        ::_M_realloc_insert<irr::scene::CSceneManager::DefaultNodeEntry>
                  (&(this->SolidNodeList).m_data,__position,(DefaultNodeEntry *)&local_38);
      }
      else {
        (__position._M_current)->Node = local_38.Node;
        (__position._M_current)->TextureValue = (void *)local_38.Distance;
        ppDVar1 = &(this->SolidNodeList).m_data.
                   super__Vector_base<irr::scene::CSceneManager::DefaultNodeEntry,_std::allocator<irr::scene::CSceneManager::DefaultNodeEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
      }
      (this->SolidNodeList).is_sorted = false;
      return 1;
    }
    if (pass == ESNRP_TRANSPARENT_EFFECT) {
      iVar6 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this);
      if ((char)iVar6 == '\0') {
        local_38.Node = local_28;
        iVar6 = (*local_28->_vptr_ISceneNode[10])();
        lVar8 = CONCAT44(extraout_var_02,iVar6);
        fVar12 = *(float *)(lVar8 + 0x30) - (this->camWorldPos).X;
        fVar13 = *(float *)(lVar8 + 0x34) - (this->camWorldPos).Y;
        fVar14 = *(float *)(lVar8 + 0x38) - (this->camWorldPos).Z;
        local_38.Distance = (f64)(double)(fVar14 * fVar14 + fVar12 * fVar12 + fVar13 * fVar13);
        iVar9._M_current =
             (this->TransparentEffectNodeList).m_data.
             super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->TransparentEffectNodeList).m_data.
            super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::
          vector<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
          ::_M_realloc_insert<irr::scene::CSceneManager::TransparentNodeEntry>
                    (&(this->TransparentEffectNodeList).m_data,iVar9,&local_38);
        }
        else {
          (iVar9._M_current)->Node = local_38.Node;
          (iVar9._M_current)->Distance = local_38.Distance;
          ppTVar2 = &(this->TransparentEffectNodeList).m_data.
                     super__Vector_base<irr::scene::CSceneManager::TransparentNodeEntry,_std::allocator<irr::scene::CSceneManager::TransparentNodeEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppTVar2 = *ppTVar2 + 1;
        }
        (this->TransparentEffectNodeList).is_sorted = false;
        return 1;
      }
      return 0;
    }
    if (pass != ESNRP_GUI) {
      return 0;
    }
    iVar6 = (*(this->super_ISceneManager)._vptr_ISceneManager[0x23])(this);
    if ((char)iVar6 != '\0') {
      return 0;
    }
    this_00 = &this->GuiNodeList;
  }
  core::array<irr::scene::ISceneNode_*>::push_back(this_00,&local_28);
  return 1;
}

Assistant:

u32 CSceneManager::registerNodeForRendering(ISceneNode *node, E_SCENE_NODE_RENDER_PASS pass)
{
	u32 taken = 0;

	switch (pass) {
		// take camera if it is not already registered
	case ESNRP_CAMERA: {
		taken = 1;
		for (u32 i = 0; i != CameraList.size(); ++i) {
			if (CameraList[i] == node) {
				taken = 0;
				break;
			}
		}
		if (taken) {
			CameraList.push_back(node);
		}
	} break;
	case ESNRP_SKY_BOX:
		SkyBoxList.push_back(node);
		taken = 1;
		break;
	case ESNRP_SOLID:
		if (!isCulled(node)) {
			SolidNodeList.push_back(node);
			taken = 1;
		}
		break;
	case ESNRP_TRANSPARENT:
		if (!isCulled(node)) {
			TransparentNodeList.push_back(TransparentNodeEntry(node, camWorldPos));
			taken = 1;
		}
		break;
	case ESNRP_TRANSPARENT_EFFECT:
		if (!isCulled(node)) {
			TransparentEffectNodeList.push_back(TransparentNodeEntry(node, camWorldPos));
			taken = 1;
		}
		break;
	case ESNRP_AUTOMATIC:
		if (!isCulled(node)) {
			const u32 count = node->getMaterialCount();

			taken = 0;
			for (u32 i = 0; i < count; ++i) {
				if (Driver->needsTransparentRenderPass(node->getMaterial(i))) {
					// register as transparent node
					TransparentNodeEntry e(node, camWorldPos);
					TransparentNodeList.push_back(e);
					taken = 1;
					break;
				}
			}

			// not transparent, register as solid
			if (!taken) {
				SolidNodeList.push_back(node);
				taken = 1;
			}
		}
		break;
	case ESNRP_GUI:
		if (!isCulled(node)) {
			GuiNodeList.push_back(node);
			taken = 1;
		}

	// as of yet unused
	case ESNRP_LIGHT:
	case ESNRP_SHADOW:
	case ESNRP_NONE: // ignore this one
		break;
	}

	return taken;
}